

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_function_info.cpp
# Opt level: O2

void __thiscall
duckdb::CreateTableFunctionInfo::CreateTableFunctionInfo
          (CreateTableFunctionInfo *this,TableFunctionSet *set)

{
  pointer pTVar1;
  pointer pTVar2;
  allocator local_41;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,"main",&local_41);
  CreateFunctionInfo::CreateFunctionInfo
            (&this->super_CreateFunctionInfo,TABLE_FUNCTION_ENTRY,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  (this->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateTableFunctionInfo_027a8260;
  FunctionSet<duckdb::TableFunction>::FunctionSet
            (&(this->functions).super_FunctionSet<duckdb::TableFunction>,
             &set->super_FunctionSet<duckdb::TableFunction>);
  ::std::__cxx11::string::_M_assign((string *)&(this->super_CreateFunctionInfo).name);
  pTVar1 = *(pointer *)
            ((long)&(this->functions).super_FunctionSet<duckdb::TableFunction>.functions.
                    super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                    super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                    ._M_impl.super__Vector_impl_data + 8);
  for (pTVar2 = (this->functions).super_FunctionSet<duckdb::TableFunction>.functions.
                super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                _M_impl.super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    ::std::__cxx11::string::_M_assign
              ((string *)
               &(pTVar2->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
                name);
  }
  (this->super_CreateFunctionInfo).super_CreateInfo.internal = true;
  return;
}

Assistant:

CreateTableFunctionInfo::CreateTableFunctionInfo(TableFunctionSet set)
    : CreateFunctionInfo(CatalogType::TABLE_FUNCTION_ENTRY), functions(std::move(set)) {
	name = functions.name;
	for (auto &func : functions.functions) {
		func.name = functions.name;
	}
	internal = true;
}